

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_manyvector.c
# Opt level: O0

int check_ans(sunrealtype ans,N_Vector X,sunindextype local_length)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long in_RSI;
  undefined8 in_RDI;
  sunindextype x1len;
  sunindextype x0len;
  sunrealtype *x1;
  sunrealtype *x0;
  N_Vector Xsub [2];
  sunindextype i;
  int failure;
  long local_30;
  int local_24;
  uint local_4;
  
  local_24 = 0;
  uVar2 = N_VGetSubvector_ManyVector(in_RDI,0);
  uVar3 = N_VGetSubvector_ManyVector(in_RDI,1);
  lVar4 = N_VGetLength(uVar2);
  lVar5 = N_VGetLength(uVar3);
  lVar6 = N_VGetSubvectorArrayPointer_ManyVector(in_RDI,0);
  lVar7 = N_VGetSubvectorArrayPointer_ManyVector(in_RDI,1);
  if (in_RSI == lVar4 + lVar5) {
    for (local_30 = 0; local_30 < lVar4; local_30 = local_30 + 1) {
      iVar1 = SUNRCompare(*(undefined8 *)(lVar6 + local_30 * 8));
      local_24 = iVar1 + local_24;
    }
    for (local_30 = 0; local_30 < lVar5; local_30 = local_30 + 1) {
      iVar1 = SUNRCompare(*(undefined8 *)(lVar7 + local_30 * 8));
      local_24 = iVar1 + local_24;
    }
    local_4 = (uint)(0.0 < (double)local_24);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int check_ans(sunrealtype ans, N_Vector X, sunindextype local_length)
{
  int failure = 0;
  sunindextype i;
  N_Vector Xsub[2];
  sunrealtype *x0, *x1;
  sunindextype x0len, x1len;

  Xsub[0] = N_VGetSubvector_ManyVector(X, 0);
  Xsub[1] = N_VGetSubvector_ManyVector(X, 1);
  x0len   = N_VGetLength(Xsub[0]);
  x1len   = N_VGetLength(Xsub[1]);
  x0      = N_VGetSubvectorArrayPointer_ManyVector(X, 0);
  x1      = N_VGetSubvectorArrayPointer_ManyVector(X, 1);

  /* ensure that local_length = x0len + x1len */
  if (local_length != x0len + x1len) { return (1); }

  /* check vector data */
  for (i = 0; i < x0len; i++) { failure += SUNRCompare(x0[i], ans); }
  for (i = 0; i < x1len; i++) { failure += SUNRCompare(x1[i], ans); }

  return (failure > ZERO) ? (1) : (0);
}